

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

int HasAlpha32b_SSE2(uint8_t *src,int length)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int in_ESI;
  long in_RDI;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar14;
  undefined1 auVar13 [16];
  int mask;
  __m128i bits;
  __m128i d;
  __m128i c1;
  __m128i c0;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  int i;
  __m128i all_0xff;
  __m128i alpha_mask;
  int local_29c;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  int mask_1;
  __m128i bits_1;
  __m128i d_1;
  __m128i c;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  
  iVar10 = in_ESI * 4 + -3;
  for (local_29c = 0; local_29c + 0x40 <= iVar10; local_29c = local_29c + 0x40) {
    puVar1 = (ulong *)(in_RDI + 0x10 + (long)local_29c);
    puVar2 = (ulong *)(in_RDI + 0x20 + (long)local_29c);
    puVar3 = (ulong *)(in_RDI + 0x30 + (long)local_29c);
    auVar9._8_8_ = ((ulong *)(in_RDI + local_29c))[1] & 0xff000000ff;
    auVar9._0_8_ = *(ulong *)(in_RDI + local_29c) & 0xff000000ff;
    auVar11._8_8_ = puVar1[1] & 0xff000000ff;
    auVar11._0_8_ = *puVar1 & 0xff000000ff;
    auVar11 = packssdw(auVar9,auVar11);
    auVar8._8_8_ = puVar2[1] & 0xff000000ff;
    auVar8._0_8_ = *puVar2 & 0xff000000ff;
    auVar12._8_8_ = puVar3[1] & 0xff000000ff;
    auVar12._0_8_ = *puVar3 & 0xff000000ff;
    auVar12 = packssdw(auVar8,auVar12);
    local_228 = auVar11._0_2_;
    sStack_226 = auVar11._2_2_;
    sStack_224 = auVar11._4_2_;
    sStack_222 = auVar11._6_2_;
    sStack_220 = auVar11._8_2_;
    sStack_21e = auVar11._10_2_;
    sStack_21c = auVar11._12_2_;
    sStack_21a = auVar11._14_2_;
    local_238 = auVar12._0_2_;
    sStack_236 = auVar12._2_2_;
    sStack_234 = auVar12._4_2_;
    sStack_232 = auVar12._6_2_;
    sStack_230 = auVar12._8_2_;
    sStack_22e = auVar12._10_2_;
    sStack_22c = auVar12._12_2_;
    sStack_22a = auVar12._14_2_;
    bVar14 = -((char)((0 < sStack_22a) * (sStack_22a < 0x100) * auVar12[0xe] - (0xff < sStack_22a))
              == -1);
    auVar13[1] = -((char)((0 < sStack_226) * (sStack_226 < 0x100) * auVar11[2] - (0xff < sStack_226)
                         ) == -1);
    auVar13[0] = -((char)((0 < local_228) * (local_228 < 0x100) * auVar11[0] - (0xff < local_228))
                  == -1);
    auVar13[2] = -((char)((0 < sStack_224) * (sStack_224 < 0x100) * auVar11[4] - (0xff < sStack_224)
                         ) == -1);
    auVar13[3] = -((char)((0 < sStack_222) * (sStack_222 < 0x100) * auVar11[6] - (0xff < sStack_222)
                         ) == -1);
    auVar13[4] = -((char)((0 < sStack_220) * (sStack_220 < 0x100) * auVar11[8] - (0xff < sStack_220)
                         ) == -1);
    auVar13[5] = -((char)((0 < sStack_21e) * (sStack_21e < 0x100) * auVar11[10] -
                         (0xff < sStack_21e)) == -1);
    auVar13[6] = -((char)((0 < sStack_21c) * (sStack_21c < 0x100) * auVar11[0xc] -
                         (0xff < sStack_21c)) == -1);
    auVar13[7] = -((char)((0 < sStack_21a) * (sStack_21a < 0x100) * auVar11[0xe] -
                         (0xff < sStack_21a)) == -1);
    uVar4 = CONCAT17(bVar14,CONCAT16(-((char)((0 < sStack_22c) * (sStack_22c < 0x100) * auVar12[0xc]
                                             - (0xff < sStack_22c)) == -1),
                                     CONCAT15(-((char)((0 < sStack_22e) * (sStack_22e < 0x100) *
                                                       auVar12[10] - (0xff < sStack_22e)) == -1),
                                              CONCAT14(-((char)((0 < sStack_230) *
                                                                (sStack_230 < 0x100) * auVar12[8] -
                                                               (0xff < sStack_230)) == -1),
                                                       CONCAT13(-((char)((0 < sStack_232) *
                                                                         (sStack_232 < 0x100) *
                                                                         auVar12[6] -
                                                                        (0xff < sStack_232)) == -1),
                                                                CONCAT12(-((char)((0 < sStack_234) *
                                                                                  (sStack_234 <
                                                                                  0x100) * auVar12[4
                                                  ] - (0xff < sStack_234)) == -1),
                                                  CONCAT11(-((char)((0 < sStack_236) *
                                                                    (sStack_236 < 0x100) *
                                                                    auVar12[2] - (0xff < sStack_236)
                                                                   ) == -1),
                                                           -((char)((0 < local_238) *
                                                                    (local_238 < 0x100) * auVar12[0]
                                                                   - (0xff < local_238)) == -1))))))
                                    ));
    auVar13._8_8_ = uVar4;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)((byte)(uVar4 >> 7) & 1) << 8 | (ushort)((byte)(uVar4 >> 0xf) & 1) << 9 |
                 (ushort)((byte)(uVar4 >> 0x17) & 1) << 10 |
                 (ushort)((byte)(uVar4 >> 0x1f) & 1) << 0xb |
                 (ushort)((byte)(uVar4 >> 0x27) & 1) << 0xc |
                 (ushort)((byte)(uVar4 >> 0x2f) & 1) << 0xd |
                 (ushort)((byte)(uVar4 >> 0x37) & 1) << 0xe | (ushort)(bVar14 >> 7) << 0xf) !=
        0xffff) {
      return 1;
    }
  }
  for (; local_29c + 0x20 <= iVar10; local_29c = local_29c + 0x20) {
    puVar1 = (ulong *)(in_RDI + 0x10 + (long)local_29c);
    auVar7._8_8_ = ((ulong *)(in_RDI + local_29c))[1] & 0xff000000ff;
    auVar7._0_8_ = *(ulong *)(in_RDI + local_29c) & 0xff000000ff;
    auVar6._8_8_ = puVar1[1] & 0xff000000ff;
    auVar6._0_8_ = *puVar1 & 0xff000000ff;
    auVar13 = packssdw(auVar7,auVar6);
    local_248 = auVar13._0_2_;
    sStack_246 = auVar13._2_2_;
    sStack_244 = auVar13._4_2_;
    sStack_242 = auVar13._6_2_;
    sStack_240 = auVar13._8_2_;
    sStack_23e = auVar13._10_2_;
    sStack_23c = auVar13._12_2_;
    sStack_23a = auVar13._14_2_;
    bVar14 = -((char)((0 < sStack_23a) * (sStack_23a < 0x100) * auVar13[0xe] - (0xff < sStack_23a))
              == -1);
    auVar5[1] = -((char)((0 < sStack_246) * (sStack_246 < 0x100) * auVar13[2] - (0xff < sStack_246))
                 == -1);
    auVar5[0] = -((char)((0 < local_248) * (local_248 < 0x100) * auVar13[0] - (0xff < local_248)) ==
                 -1);
    auVar5[2] = -((char)((0 < sStack_244) * (sStack_244 < 0x100) * auVar13[4] - (0xff < sStack_244))
                 == -1);
    auVar5[3] = -((char)((0 < sStack_242) * (sStack_242 < 0x100) * auVar13[6] - (0xff < sStack_242))
                 == -1);
    auVar5[4] = -((char)((0 < sStack_240) * (sStack_240 < 0x100) * auVar13[8] - (0xff < sStack_240))
                 == -1);
    auVar5[5] = -((char)((0 < sStack_23e) * (sStack_23e < 0x100) * auVar13[10] - (0xff < sStack_23e)
                        ) == -1);
    auVar5[6] = -((char)((0 < sStack_23c) * (sStack_23c < 0x100) * auVar13[0xc] -
                        (0xff < sStack_23c)) == -1);
    auVar5[7] = -((char)((0 < sStack_23a) * (sStack_23a < 0x100) * auVar13[0xe] -
                        (0xff < sStack_23a)) == -1);
    uVar4 = CONCAT17(bVar14,CONCAT16(-((char)((0 < sStack_23c) * (sStack_23c < 0x100) * auVar13[0xc]
                                             - (0xff < sStack_23c)) == -1),
                                     CONCAT15(-((char)((0 < sStack_23e) * (sStack_23e < 0x100) *
                                                       auVar13[10] - (0xff < sStack_23e)) == -1),
                                              CONCAT14(-((char)((0 < sStack_240) *
                                                                (sStack_240 < 0x100) * auVar13[8] -
                                                               (0xff < sStack_240)) == -1),
                                                       CONCAT13(-((char)((0 < sStack_242) *
                                                                         (sStack_242 < 0x100) *
                                                                         auVar13[6] -
                                                                        (0xff < sStack_242)) == -1),
                                                                CONCAT12(-((char)((0 < sStack_244) *
                                                                                  (sStack_244 <
                                                                                  0x100) * auVar13[4
                                                  ] - (0xff < sStack_244)) == -1),
                                                  CONCAT11(-((char)((0 < sStack_246) *
                                                                    (sStack_246 < 0x100) *
                                                                    auVar13[2] - (0xff < sStack_246)
                                                                   ) == -1),
                                                           -((char)((0 < local_248) *
                                                                    (local_248 < 0x100) * auVar13[0]
                                                                   - (0xff < local_248)) == -1))))))
                                    ));
    auVar5._8_8_ = uVar4;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 | (ushort)((byte)(uVar4 >> 7) & 1) << 8
                 | (ushort)((byte)(uVar4 >> 0xf) & 1) << 9 |
                 (ushort)((byte)(uVar4 >> 0x17) & 1) << 10 |
                 (ushort)((byte)(uVar4 >> 0x1f) & 1) << 0xb |
                 (ushort)((byte)(uVar4 >> 0x27) & 1) << 0xc |
                 (ushort)((byte)(uVar4 >> 0x2f) & 1) << 0xd |
                 (ushort)((byte)(uVar4 >> 0x37) & 1) << 0xe | (ushort)(bVar14 >> 7) << 0xf) !=
        0xffff) {
      return 1;
    }
  }
  while( true ) {
    if (iVar10 < local_29c) {
      return 0;
    }
    if (*(char *)(in_RDI + local_29c) != -1) break;
    local_29c = local_29c + 4;
  }
  return 1;
}

Assistant:

static int HasAlpha32b_SSE2(const uint8_t* src, int length) {
  const __m128i alpha_mask = _mm_set1_epi32(0xff);
  const __m128i all_0xff = _mm_set1_epi8((char)0xff);
  int i = 0;
  // We don't know if we can access the last 3 bytes after the last alpha
  // value 'src[4 * length - 4]' (because we don't know if alpha is the first
  // or the last byte of the quadruplet). Hence the '-3' protection below.
  length = length * 4 - 3;   // size in bytes
  for (; i + 64 <= length; i += 64) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(src + i +  0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(src + i + 16));
    const __m128i a2 = _mm_loadu_si128((const __m128i*)(src + i + 32));
    const __m128i a3 = _mm_loadu_si128((const __m128i*)(src + i + 48));
    const __m128i b0 = _mm_and_si128(a0, alpha_mask);
    const __m128i b1 = _mm_and_si128(a1, alpha_mask);
    const __m128i b2 = _mm_and_si128(a2, alpha_mask);
    const __m128i b3 = _mm_and_si128(a3, alpha_mask);
    const __m128i c0 = _mm_packs_epi32(b0, b1);
    const __m128i c1 = _mm_packs_epi32(b2, b3);
    const __m128i d  = _mm_packus_epi16(c0, c1);
    const __m128i bits = _mm_cmpeq_epi8(d, all_0xff);
    const int mask = _mm_movemask_epi8(bits);
    if (mask != 0xffff) return 1;
  }
  for (; i + 32 <= length; i += 32) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(src + i +  0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(src + i + 16));
    const __m128i b0 = _mm_and_si128(a0, alpha_mask);
    const __m128i b1 = _mm_and_si128(a1, alpha_mask);
    const __m128i c  = _mm_packs_epi32(b0, b1);
    const __m128i d  = _mm_packus_epi16(c, c);
    const __m128i bits = _mm_cmpeq_epi8(d, all_0xff);
    const int mask = _mm_movemask_epi8(bits);
    if (mask != 0xffff) return 1;
  }
  for (; i <= length; i += 4) if (src[i] != 0xff) return 1;
  return 0;
}